

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store.c
# Opt level: O0

void borg_init_store(void)

{
  char *fmt;
  borg_item_conflict *pbVar1;
  int local_c;
  wchar_t i;
  
  if (f_info[0xe].shopnum != '\b') {
    fmt = format("borg thinks home is %d, game thinks home is %d.  aborting. ",
                 (ulong)(f_info[0xe].shopnum - 1),7);
    msg(fmt);
    borg_init_failure = true;
  }
  borg_shops = (borg_shop *)mem_zalloc((ulong)z_info->store_max << 3);
  borg_safe_shops = (borg_shop *)mem_zalloc((ulong)z_info->store_max << 3);
  for (local_c = 0; local_c < (int)(uint)z_info->store_max; local_c = local_c + 1) {
    pbVar1 = (borg_item_conflict *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
    borg_shops[local_c].ware = pbVar1;
    pbVar1 = (borg_item_conflict *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
    borg_safe_shops[local_c].ware = pbVar1;
  }
  borg_init_store_sell();
  return;
}

Assistant:

void borg_init_store(void)
{
    if (f_info[FEAT_HOME].shopnum - 1 != BORG_HOME) {
        msg(format("borg thinks home is %d, game thinks home is %d.  aborting. ", 
            f_info[FEAT_HOME].shopnum - 1, BORG_HOME));
        borg_init_failure = true;
    }


    /* Make the stores in the town */
    borg_shops = mem_zalloc(z_info->store_max * sizeof(borg_shop));

    /* Make the "safe" stores in the town */
    borg_safe_shops = mem_zalloc(z_info->store_max * sizeof(borg_shop));

    for (int i = 0; i < z_info->store_max; i++) {
        borg_shops[i].ware = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));
        borg_safe_shops[i].ware = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));
    }

    borg_init_store_sell();
}